

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O2

void __thiscall
WavingSketch<8U,_1U,_4U>::mergebuck
          (WavingSketch<8U,_1U,_4U> *this,Bucket *src1,Bucket *src2,Bucket *dest)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined1 (*pauVar4) [32];
  long lVar5;
  undefined1 (*pauVar6) [32];
  undefined1 auVar7 [16];
  
  dest->incast[0] = src2->incast[0] + src1->incast[0];
  pauVar4 = (undefined1 (*) [32])operator_new__(0x80);
  auVar7 = ZEXT816(0) << 0x40;
  *pauVar4 = ZEXT1632(auVar7);
  pauVar4[1] = ZEXT1632(auVar7);
  pauVar4[2] = ZEXT1632(auVar7);
  pauVar4[3] = ZEXT1632(auVar7);
  iVar2 = this->cnt;
  pauVar6 = pauVar4;
  for (lVar5 = -0x20; lVar5 != 0; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)*pauVar6 + 4) = *(undefined4 *)((long)src1->counters + lVar5);
    iVar1 = *(int *)((long)src1->incast + lVar5);
    *(int *)*pauVar6 = iVar1;
    pauVar6 = (undefined1 (*) [32])((long)*pauVar6 + 8);
    iVar2 = iVar2 + -1 + (uint)(iVar1 == 0);
    this->cnt = iVar2;
  }
  for (lVar5 = -0x20; lVar5 != 0; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)*pauVar6 + 4) = *(undefined4 *)((long)src2->counters + lVar5);
    iVar1 = *(int *)((long)src2->incast + lVar5);
    *(int *)*pauVar6 = iVar1;
    iVar2 = iVar2 + -1 + (uint)(iVar1 == 0);
    this->cnt = iVar2;
    pauVar6 = (undefined1 (*) [32])((long)*pauVar6 + 8);
  }
  std::
  __sort<WavingSketch<8u,1u,4u>::node*,__gnu_cxx::__ops::_Iter_comp_iter<WavingSketch<8u,1u,4u>::mergebuck(WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*,WavingSketch<8u,1u,4u>::Bucket*)::_lambda(WavingSketch<8u,1u,4u>::node,WavingSketch<8u,1u,4u>::node)_1_>>
            (pauVar4);
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    *(undefined4 *)dest->items[lVar5].str = *(undefined4 *)((long)*pauVar4 + lVar5 * 8 + 4);
    iVar2 = *(int *)((long)*pauVar4 + lVar5 * 8);
    dest->counters[lVar5] = iVar2;
    this->cnt = (this->cnt + 1) - (uint)(iVar2 == 0);
  }
  for (lVar5 = 0; (lVar5 != 0x40 && (*(int *)(pauVar4[2] + lVar5) < 0)); lVar5 = lVar5 + 8) {
    uVar3 = Data<4U>::Hash((Data<4U> *)(pauVar4[2] + lVar5 + 4),this->seed_s);
    Data<4U>::Hash((Data<4U> *)(pauVar4[2] + lVar5 + 4),this->seed_incast);
    dest->incast[0] =
         dest->incast[0] - (short)*(undefined4 *)(pauVar4[2] + lVar5) * (short)COUNT[uVar3 & 1];
  }
  operator_delete__(pauVar4);
  return;
}

Assistant:

void mergebuck(Bucket* src1, Bucket* src2, Bucket* dest) {
		for (int i = 0; i < counter_num; i++)
			dest->incast[i] = src1->incast[i] + src2->incast[i];
		node* tp1 = new node[slot_num << 1];
		node* p = tp1;
		for (uint32_t i = 0; i < slot_num; i++) {
			p->item = src1->items[i];
			p->counter = src1->counters[i];
			p++;
			cnt -= src1->counters[i] != 0;
		}
		for (uint32_t i = 0; i < slot_num; i++) {
			p->item = src2->items[i];
			p->counter = src2->counters[i];
			cnt -= src2->counters[i] != 0;
			p++;
		}
		std::sort(tp1, p, [](node x, node y)-> bool {return abs(x.counter) > abs(y.counter); });
		uint32_t i = 0;
		for (i = 0; i < slot_num; i++) {
			dest->items[i] = tp1[i].item;
			dest->counters[i] = tp1[i].counter;
			cnt += tp1[i].counter != 0;
		}
		uint32_t end = slot_num << 1;
		while (i < end && tp1[i].counter < 0)  // flag=true
		{
			uint32_t min_choice = tp1[i].item.Hash(seed_s) & 1;
			uint32_t whichcast = tp1[i].item.Hash(seed_incast) % counter_num;
			dest->incast[whichcast] -= COUNT[min_choice] * tp1[i].counter;
			i++;
		}
		delete[] tp1;
	}